

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O2

void RestartModel(CPpmd7 *p)

{
  Byte *pBVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  Byte *pBVar5;
  ulong uVar6;
  ulong uVar7;
  UInt16 (*paUVar8) [64];
  uint uVar9;
  CPpmd7_Context *pCVar10;
  Byte *pBVar11;
  CPpmd_State *pCVar12;
  UInt16 (*paUVar13) [64];
  long lVar14;
  long lVar15;
  
  lVar15 = 0;
  memset(p->FreeList,0,0x98);
  pBVar5 = p->Base;
  uVar3 = p->AlignOffset;
  pBVar11 = pBVar5 + uVar3;
  p->Text = pBVar11;
  uVar4 = p->MaxOrder;
  uVar7 = (ulong)p->Size;
  uVar6 = (ulong)((p->Size / 0x60) * 0x54);
  pCVar12 = (CPpmd_State *)(pBVar11 + (uVar7 - uVar6));
  p->UnitsStart = (Byte *)pCVar12;
  p->GlueCount = 0;
  p->OrderFall = uVar4;
  uVar9 = 0xc;
  if (uVar4 < 0xc) {
    uVar9 = uVar4;
  }
  p->InitRL = ~uVar9;
  p->RunLength = ~uVar9;
  p->PrevSuccess = 0;
  pCVar10 = (CPpmd7_Context *)(pBVar11 + (uVar7 - 0xc));
  p->HiUnit = (Byte *)pCVar10;
  p->MaxContext = pCVar10;
  p->MinContext = pCVar10;
  pBVar1 = pBVar11 + (uVar7 - 4);
  pBVar1[0] = '\0';
  pBVar1[1] = '\0';
  pBVar1[2] = '\0';
  pBVar1[3] = '\0';
  pCVar10->NumStats = 0x100;
  pCVar10->SummFreq = 0x101;
  p->FoundState = pCVar12;
  p->LoUnit = &pCVar12[0x100].Symbol;
  *(int *)(pBVar11 + (uVar7 - 8)) = (int)pCVar12 - (int)pBVar5;
  pBVar5 = pBVar5 + ((uVar7 + uVar3) - uVar6) + 4;
  for (; lVar15 != 0x100; lVar15 = lVar15 + 1) {
    pBVar5[-4] = (Byte)lVar15;
    pBVar5[-3] = '\x01';
    pBVar5[-2] = '\0';
    pBVar5[-1] = '\0';
    pBVar5[0] = '\0';
    pBVar5[1] = '\0';
    pBVar5 = pBVar5 + 6;
  }
  paUVar8 = p->BinSumm;
  for (lVar15 = 0; lVar15 != 0x80; lVar15 = lVar15 + 1) {
    paUVar13 = paUVar8;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      uVar2 = kInitBinEsc[lVar14];
      for (uVar6 = 0; uVar6 < 0x40; uVar6 = uVar6 + 8) {
        (*paUVar13)[uVar6] = 0x4000 - (short)((uint)uVar2 / ((int)lVar15 + 2U));
      }
      paUVar13 = (UInt16 (*) [64])(*paUVar13 + 1);
    }
    paUVar8 = paUVar8 + 1;
  }
  pBVar11 = &p->See[0][0].Count;
  for (lVar15 = 0; lVar15 != 0x19; lVar15 = lVar15 + 1) {
    for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
      *(undefined2 *)(pBVar11 + lVar14 * 4 + -1) = 0x403;
      *(short *)(pBVar11 + lVar14 * 4 + -3) = (short)lVar15 * 0x28 + 0x50;
    }
    pBVar11 = pBVar11 + 0x40;
  }
  return;
}

Assistant:

static void RestartModel(CPpmd7 *p)
{
  unsigned i, k, m;

  memset(p->FreeList, 0, sizeof(p->FreeList));
  p->Text = p->Base + p->AlignOffset;
  p->HiUnit = p->Text + p->Size;
  p->LoUnit = p->UnitsStart = p->HiUnit - p->Size / 8 / UNIT_SIZE * 7 * UNIT_SIZE;
  p->GlueCount = 0;

  p->OrderFall = p->MaxOrder;
  p->RunLength = p->InitRL = -(Int32)((p->MaxOrder < 12) ? p->MaxOrder : 12) - 1;
  p->PrevSuccess = 0;

  p->MinContext = p->MaxContext = (CTX_PTR)(p->HiUnit -= UNIT_SIZE); /* AllocContext(p); */
  p->MinContext->Suffix = 0;
  p->MinContext->NumStats = 256;
  p->MinContext->SummFreq = 256 + 1;
  p->FoundState = (CPpmd_State *)p->LoUnit; /* AllocUnits(p, PPMD_NUM_INDEXES - 1); */
  p->LoUnit += U2B(256 / 2);
  p->MinContext->Stats = REF(p->FoundState);
  for (i = 0; i < 256; i++)
  {
    CPpmd_State *s = &p->FoundState[i];
    s->Symbol = (Byte)i;
    s->Freq = 1;
    SetSuccessor(s, 0);
  }

  for (i = 0; i < 128; i++)
    for (k = 0; k < 8; k++)
    {
      UInt16 *dest = p->BinSumm[i] + k;
      UInt16 val = (UInt16)(PPMD_BIN_SCALE - kInitBinEsc[k] / (i + 2));
      for (m = 0; m < 64; m += 8)
        dest[m] = val;
    }
  
  for (i = 0; i < 25; i++)
    for (k = 0; k < 16; k++)
    {
      CPpmd_See *s = &p->See[i][k];
      s->Summ = (UInt16)((5 * i + 10) << (s->Shift = PPMD_PERIOD_BITS - 4));
      s->Count = 4;
    }
}